

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureWrapTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::TextureWrapTests::init(TextureWrapTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  deBool dVar2;
  int extraout_EAX;
  TextureWrapCase *pTVar3;
  RenderContext *pRVar4;
  ContextInfo *pCVar5;
  char *pcVar6;
  bool local_382;
  bool local_381;
  allocator<char> local_371;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  undefined1 local_330 [8];
  string name_2;
  int filter_2;
  undefined1 local_2e8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  npotFilenames;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [8];
  string name_1;
  int filter_1;
  int wrapT_1;
  int wrapS_1;
  undefined1 local_1b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  potFilenames;
  allocator<char> local_189;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string name;
  bool is_repeat_mirror;
  int iStack_40;
  bool is_clamp_clamp;
  int format;
  int size;
  int filter;
  int wrapT;
  int wrapS;
  TextureWrapTests *this_local;
  
  for (filter = 0; filter < 3; filter = filter + 1) {
    for (size = 0; size < 3; size = size + 1) {
      for (format = 0; format < 2; format = format + 1) {
        for (iStack_40 = 0; iStack_40 < 2; iStack_40 = iStack_40 + 1) {
          for (name.field_2._12_4_ = 0; (int)name.field_2._12_4_ < 4;
              name.field_2._12_4_ = name.field_2._12_4_ + 1) {
            local_381 = false;
            if (init::wrapModes[filter].mode == 0x812f) {
              local_381 = init::wrapModes[size].mode == 0x812f;
            }
            name.field_2._M_local_buf[0xb] = local_381;
            local_382 = false;
            if (init::wrapModes[filter].mode == 0x2901) {
              local_382 = init::wrapModes[size].mode == 0x8370;
            }
            name.field_2._M_local_buf[10] = local_382;
            if ((((local_381 != false) || (local_382 != false)) || (name.field_2._12_4_ == 0)) &&
               ((local_381 != false ||
                ((dVar2 = ::deIsPowerOfTwo32(init::sizes[iStack_40].width), dVar2 != 0 &&
                 (dVar2 = ::deIsPowerOfTwo32(init::sizes[iStack_40].height), dVar2 != 0)))))) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"",&local_189)
              ;
              std::operator+(&local_168,&local_188,init::wrapModes[filter].name);
              std::operator+(&local_148,&local_168,"_");
              std::operator+(&local_128,&local_148,init::wrapModes[size].name);
              std::operator+(&local_108,&local_128,"_");
              std::operator+(&local_e8,&local_108,init::filteringModes[format].name);
              std::operator+(&local_c8,&local_e8,"_");
              std::operator+(&local_a8,&local_c8,init::sizes[iStack_40].name);
              std::operator+(&local_88,&local_a8,"_");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_68,&local_88,init::formats[(int)name.field_2._12_4_].name);
              std::__cxx11::string::~string((string *)&local_88);
              std::__cxx11::string::~string((string *)&local_a8);
              std::__cxx11::string::~string((string *)&local_c8);
              std::__cxx11::string::~string((string *)&local_e8);
              std::__cxx11::string::~string((string *)&local_108);
              std::__cxx11::string::~string((string *)&local_128);
              std::__cxx11::string::~string((string *)&local_148);
              std::__cxx11::string::~string((string *)&local_168);
              std::__cxx11::string::~string((string *)&local_188);
              std::allocator<char>::~allocator(&local_189);
              pTVar3 = (TextureWrapCase *)operator_new(0x118);
              pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
              pRVar4 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
              pCVar5 = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
              pcVar6 = (char *)std::__cxx11::string::c_str();
              TextureWrapCase::TextureWrapCase
                        (pTVar3,pTVar1,pRVar4,pCVar5,pcVar6,"",
                         init::formats[(int)name.field_2._12_4_].format,
                         init::formats[(int)name.field_2._12_4_].dataType,
                         init::wrapModes[filter].mode,init::wrapModes[size].mode,
                         init::filteringModes[format].mode,init::filteringModes[format].mode,
                         init::sizes[iStack_40].width,init::sizes[iStack_40].height);
              tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
              std::__cxx11::string::~string((string *)local_68);
            }
          }
        }
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&wrapS_1,"data/etc1/photo_helsinki_mip_0.pkm",
             (allocator<char> *)((long)&wrapT_1 + 3));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1b8,(value_type *)&wrapS_1);
  std::__cxx11::string::~string((string *)&wrapS_1);
  std::allocator<char>::~allocator((allocator<char> *)((long)&wrapT_1 + 3));
  for (filter_1 = 0; filter_1 < 3; filter_1 = filter_1 + 1) {
    for (name_1.field_2._12_4_ = 0; (int)name_1.field_2._12_4_ < 3;
        name_1.field_2._12_4_ = name_1.field_2._12_4_ + 1) {
      for (name_1.field_2._8_4_ = 0; (int)name_1.field_2._8_4_ < 2;
          name_1.field_2._8_4_ = name_1.field_2._8_4_ + 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2c8,"",
                   (allocator<char> *)
                   ((long)&npotFilenames.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::operator+(&local_2a8,&local_2c8,init::wrapModes[filter_1].name);
        std::operator+(&local_288,&local_2a8,"_");
        std::operator+(&local_268,&local_288,init::wrapModes[(int)name_1.field_2._12_4_].name);
        std::operator+(&local_248,&local_268,"_");
        std::operator+(&local_228,&local_248,init::filteringModes[(int)name_1.field_2._8_4_].name);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_208,&local_228,"_pot_etc1");
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)&local_288);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&npotFilenames.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        pTVar3 = (TextureWrapCase *)operator_new(0x118);
        pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
        pRVar4 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
        pCVar5 = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        TextureWrapCase::TextureWrapCase
                  (pTVar3,pTVar1,pRVar4,pCVar5,pcVar6,"",init::wrapModes[filter_1].mode,
                   init::wrapModes[(int)name_1.field_2._12_4_].mode,
                   init::filteringModes[(int)name_1.field_2._8_4_].mode,
                   init::filteringModes[(int)name_1.field_2._8_4_].mode,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1b8);
        tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
        std::__cxx11::string::~string((string *)local_208);
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_2e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filter_2,"data/etc1/photo_helsinki_113x89.pkm",
             (allocator<char> *)(name_2.field_2._M_local_buf + 0xf));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2e8,(value_type *)&filter_2);
  std::__cxx11::string::~string((string *)&filter_2);
  std::allocator<char>::~allocator((allocator<char> *)(name_2.field_2._M_local_buf + 0xf));
  for (name_2.field_2._8_4_ = 0; (int)name_2.field_2._8_4_ < 2;
      name_2.field_2._8_4_ = name_2.field_2._8_4_ + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_370,"clamp_clamp_",&local_371);
    std::operator+(&local_350,&local_370,init::filteringModes[(int)name_2.field_2._8_4_].name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330,
                   &local_350,"_npot_etc1");
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_370);
    std::allocator<char>::~allocator(&local_371);
    pTVar3 = (TextureWrapCase *)operator_new(0x118);
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar4 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    pCVar5 = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    TextureWrapCase::TextureWrapCase
              (pTVar3,pTVar1,pRVar4,pCVar5,pcVar6,"",0x812f,0x812f,
               init::filteringModes[(int)name_2.field_2._8_4_].mode,
               init::filteringModes[(int)name_2.field_2._8_4_].mode,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2e8);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
    std::__cxx11::string::~string((string *)local_330);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1b8);
  return extraout_EAX;
}

Assistant:

void TextureWrapTests::init (void)
{
	static const struct
	{
		const char*		name;
		deUint32		mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE },
		{ "repeat",		GL_REPEAT },
		{ "mirror",		GL_MIRRORED_REPEAT }
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} filteringModes[] =
	{
		{ "nearest",	GL_NEAREST },
		{ "linear",		GL_LINEAR }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
	} sizes[] =
	{
		{ "pot",		64, 128 },
		{ "npot",		63, 112 }
	};

	static const struct
	{
		const char*		name;
		deUint32		format;
		deUint32		dataType;
	} formats[] =
	{
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE },
		{ "rgb888",		GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba4444",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "l8",			GL_LUMINANCE,		GL_UNSIGNED_BYTE },
	};

#define FOR_EACH(ITERATOR, ARRAY, BODY)	\
	for (int (ITERATOR) = 0; (ITERATOR) < DE_LENGTH_OF_ARRAY(ARRAY); (ITERATOR)++)	\
		BODY

	FOR_EACH(wrapS,		wrapModes,
	FOR_EACH(wrapT,		wrapModes,
	FOR_EACH(filter,	filteringModes,
	FOR_EACH(size,		sizes,
	FOR_EACH(format,	formats,
		{
			bool is_clamp_clamp		= (wrapModes[wrapS].mode == GL_CLAMP_TO_EDGE	&& wrapModes[wrapT].mode == GL_CLAMP_TO_EDGE);
			bool is_repeat_mirror	= (wrapModes[wrapS].mode == GL_REPEAT			&& wrapModes[wrapT].mode == GL_MIRRORED_REPEAT);

			if (!is_clamp_clamp && !is_repeat_mirror && format != 0)
				continue; // Use other format varants with clamp_clamp & repeat_mirror pair only.

			if (!is_clamp_clamp && (!deIsPowerOfTwo32(sizes[size].width) || !deIsPowerOfTwo32(sizes[size].height)))
				continue; // Not supported as described in Spec section 3.8.2.

			string name = string("") + wrapModes[wrapS].name + "_" + wrapModes[wrapT].name + "_" + filteringModes[filter].name + "_" + sizes[size].name + "_" + formats[format].name;
			addChild(new TextureWrapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), name.c_str(), "",
										 formats[format].format, formats[format].dataType,
										 wrapModes[wrapS].mode,
										 wrapModes[wrapT].mode,
										 filteringModes[filter].mode, filteringModes[filter].mode,
										 sizes[size].width, sizes[size].height));

		})))));

	// Power-of-two ETC1 texture
	std::vector<std::string> potFilenames;
	potFilenames.push_back("data/etc1/photo_helsinki_mip_0.pkm");

	FOR_EACH(wrapS,		wrapModes,
	FOR_EACH(wrapT,		wrapModes,
	FOR_EACH(filter,	filteringModes,
		{
			string name = string("") + wrapModes[wrapS].name + "_" + wrapModes[wrapT].name + "_" + filteringModes[filter].name + "_pot_etc1";
			addChild(new TextureWrapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), name.c_str(), "",
										 wrapModes[wrapS].mode,
										 wrapModes[wrapT].mode,
										 filteringModes[filter].mode, filteringModes[filter].mode,
										 potFilenames));

		})));

	std::vector<std::string> npotFilenames;
	npotFilenames.push_back("data/etc1/photo_helsinki_113x89.pkm");

	// NPOT ETC1 texture
	for (int filter = 0; filter < DE_LENGTH_OF_ARRAY(filteringModes); filter++)
	{
		string name = string("clamp_clamp_") + filteringModes[filter].name + "_npot_etc1";
		addChild(new TextureWrapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), name.c_str(), "",
									 GL_CLAMP_TO_EDGE, GL_CLAMP_TO_EDGE,
									 filteringModes[filter].mode, filteringModes[filter].mode,
									 npotFilenames));
	}
}